

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O3

void __thiscall TxReconciliationTracker::Impl::ForgetPeer(Impl *this,NodeId peer_id)

{
  __node_base *p_Var1;
  size_type *psVar2;
  long lVar3;
  bool bVar4;
  Logger *this_00;
  ulong uVar5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  __buckets_ptr pp_Var9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock13;
  char *fmt;
  Impl *args;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  fmt = (char *)peer_id;
  args = this;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&stack0xffffffffffffffd8);
  pp_Var9 = (this->m_states)._M_h._M_buckets;
  uVar6 = (this->m_states)._M_h._M_bucket_count;
  uVar5 = (ulong)peer_id % uVar6;
  p_Var11 = pp_Var9[uVar5];
  if (p_Var11 == (__node_base_ptr)0x0) goto LAB_00278a5a;
  p_Var8 = p_Var11->_M_nxt;
  if (p_Var8[1]._M_nxt == (_Hash_node_base *)peer_id) {
    p_Var7 = p_Var8->_M_nxt;
    p_Var10 = p_Var11;
    if (p_Var7 == (_Hash_node_base *)0x0) {
      p_Var7 = (_Hash_node_base *)0x0;
    }
    else {
LAB_00278975:
      uVar6 = (ulong)p_Var7[1]._M_nxt % uVar6;
      if (uVar6 == uVar5) goto LAB_002789f8;
      pp_Var9[uVar6] = p_Var11;
      pp_Var9 = (this->m_states)._M_h._M_buckets;
      p_Var11 = pp_Var9[uVar5];
    }
LAB_002789e4:
    p_Var1 = &(this->m_states)._M_h._M_before_begin;
    if (p_Var1 == p_Var11) {
      p_Var1->_M_nxt = p_Var7;
    }
    pp_Var9[uVar5] = (__node_base_ptr)0x0;
  }
  else {
    do {
      p_Var10 = p_Var8;
      p_Var8 = p_Var10->_M_nxt;
      if ((p_Var8 == (_Hash_node_base *)0x0) || ((ulong)p_Var8[1]._M_nxt % uVar6 != uVar5))
      goto LAB_00278a5a;
    } while (p_Var8[1]._M_nxt != (_Hash_node_base *)peer_id);
    p_Var7 = p_Var8->_M_nxt;
    if (p_Var11 == p_Var10) {
      if (p_Var7 != (_Hash_node_base *)0x0) goto LAB_00278975;
      p_Var7 = (_Hash_node_base *)0x0;
      goto LAB_002789e4;
    }
    if ((p_Var7 != (_Hash_node_base *)0x0) &&
       (uVar6 = (ulong)p_Var7[1]._M_nxt % uVar6, uVar6 != uVar5)) {
      pp_Var9[uVar6] = p_Var10;
    }
  }
LAB_002789f8:
  p_Var10->_M_nxt = p_Var8->_M_nxt;
  operator_delete(p_Var8,0x30);
  psVar2 = &(this->m_states)._M_h._M_element_count;
  *psVar2 = *psVar2 - 1;
  this_00 = LogInstance();
  bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,TXRECONCILIATION,Debug);
  if (bVar4) {
    logging_function._M_str = "ForgetPeer";
    logging_function._M_len = 10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
    ;
    source_file._M_len = 0x62;
    LogPrintf_<long>(logging_function,source_file,0x85,
                     IPC|MEMPOOLREJ|PROXY|PRUNE|REINDEX|ESTIMATEFEE|BENCH|TOR|NET,
                     (Level)&stack0xffffffffffffffd0,fmt,(long *)args);
  }
LAB_00278a5a:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stack0xffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        if (m_states.erase(peer_id)) {
            LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Forget txreconciliation state of peer=%d\n", peer_id);
        }
    }